

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMouseClicked(ImGuiMouseButton button,bool repeat)

{
  float t1;
  float repeat_delay;
  bool bVar1;
  int iVar2;
  
  t1 = (GImGui->IO).MouseDownDuration[button];
  bVar1 = t1 == 0.0;
  if (repeat && !bVar1) {
    repeat_delay = (GImGui->IO).KeyRepeatDelay;
    if (t1 <= repeat_delay) {
      return false;
    }
    iVar2 = CalcTypematicRepeatAmount
                      (t1 - (GImGui->IO).DeltaTime,t1,repeat_delay,(GImGui->IO).KeyRepeatRate);
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}